

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O0

void cdef_copy_rect8_16bit_to_16bit_sse4_1
               (uint16_t *dst,int dstride,uint16_t *src,int sstride,int width,int height)

{
  undefined1 in_XMM0 [16];
  v128 row;
  int local_6c;
  int local_68;
  int j;
  int i;
  int height_local;
  int width_local;
  int sstride_local;
  uint16_t *src_local;
  int dstride_local;
  uint16_t *dst_local;
  
  for (local_68 = 0; local_68 < height; local_68 = local_68 + 1) {
    for (local_6c = 0; local_6c < (int)(width & 0xfffffff8U); local_6c = local_6c + 8) {
      in_XMM0 = lddqu(in_XMM0,*(undefined1 (*) [16])(src + (local_68 * sstride + local_6c)));
      *(undefined1 (*) [16])(dst + (local_68 * dstride + local_6c)) = in_XMM0;
    }
    for (; local_6c < width; local_6c = local_6c + 1) {
      dst[local_68 * dstride + local_6c] = src[local_68 * sstride + local_6c];
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_copy_rect8_16bit_to_16bit)(uint16_t *dst, int dstride,
                                               const uint16_t *src, int sstride,
                                               int width, int height) {
  int i, j;
  for (i = 0; i < height; i++) {
    for (j = 0; j < (width & ~0x7); j += 8) {
      v128 row = v128_load_unaligned(&src[i * sstride + j]);
      v128_store_unaligned(&dst[i * dstride + j], row);
    }
    for (; j < width; j++) {
      dst[i * dstride + j] = src[i * sstride + j];
    }
  }
}